

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O0

int http_conn_set_error(nng_http *conn,nng_http_status status,char *reason,char *body,char *redirect
                       )

{
  char *__s;
  size_t sVar1;
  size_t local_450;
  size_t avail;
  char *suffix;
  char *prefix;
  char content [1024];
  char *redirect_local;
  char *body_local;
  char *reason_local;
  nng_http_status status_local;
  nng_http *conn_local;
  
  conn->iserr = true;
  nni_http_set_status(conn,status,reason);
  __s = nni_http_get_reason(conn);
  redirect_local = body;
  if (body == (char *)0x0) {
    snprintf((char *)&prefix,0x400,
             "<!DOCTYPE html>\n<html><head><title>%d %s</title>\n<style>body { font-family: Arial, sans serif; text-align: center }\nh1 { font-size: 36px; }span { background-color: gray; color: white; padding: 7px; border-radius: 5px }h2 { font-size: 24px; }p { font-size: 20px; }</style></head><body><p>&nbsp;</p><h1><span>%d</span></h1><h2>%s</h2><p>"
             ,(ulong)status,__s,(ulong)status,__s);
    local_450 = strlen((char *)&prefix);
    local_450 = 0x400 - local_450;
    if (((redirect == (char *)0x0) || (sVar1 = strlen(redirect), sVar1 < 0xc9)) ||
       (sVar1 = strlen(__s), 0x27 < sVar1)) {
      if (redirect != (char *)0x0) {
        sVar1 = strlen((char *)&prefix);
        snprintf(content + (sVar1 - 8),local_450,
                 "You should be automatically redirected to <a href=\"%s\">%s</a>.",redirect,
                 redirect);
        local_450 = strlen((char *)&prefix);
        local_450 = 0x400 - local_450;
      }
    }
    else {
      sVar1 = strlen((char *)&prefix);
      snprintf(content + (sVar1 - 8),local_450,"You should be automatically redirected.");
      local_450 = strlen((char *)&prefix);
      local_450 = 0x400 - local_450;
    }
    sVar1 = strlen((char *)&prefix);
    snprintf(content + (sVar1 - 8),local_450,"%s","</p></body></html>");
    redirect_local = (char *)&prefix;
  }
  sVar1 = strlen(redirect_local);
  if (sVar1 != 0) {
    nni_http_set_content_type(conn,"text/html; charset=UTF-8");
    sVar1 = strlen(redirect_local);
    nni_http_copy_body(conn,redirect_local,sVar1);
  }
  return 0;
}

Assistant:

static int
http_conn_set_error(nng_http *conn, nng_http_status status, const char *reason,
    const char *body, const char *redirect)
{
	char        content[1024];
	const char *prefix = "<!DOCTYPE html>\n"
	                     "<html><head><title>%d %s</title>\n"
	                     "<style>"
	                     "body { font-family: Arial, sans serif; "
	                     "text-align: center }\n"
	                     "h1 { font-size: 36px; }"
	                     "span { background-color: gray; color: white; "
	                     "padding: 7px; "
	                     "border-radius: 5px }"
	                     "h2 { font-size: 24px; }"
	                     "p { font-size: 20px; }"
	                     "</style></head>"
	                     "<body><p>&nbsp;</p>"
	                     "<h1><span>%d</span></h1>"
	                     "<h2>%s</h2><p>";
	const char *suffix = "</p></body></html>";

	conn->iserr = true;

	nni_http_set_status(conn, status, reason);
	reason = nni_http_get_reason(conn);

	if (body == NULL) {
		snprintf(content, sizeof(content), prefix, status, reason,
		    status, reason);
		size_t avail = sizeof(content) - strlen(content);

		if (redirect != NULL && strlen(redirect) > 200 &&
		    strlen(reason) < 40) {
			// URL is too long for buffer and unlikely to be useful
			// to humans anyway.  600 bytes will fit in the 1K
			// buffer without issue.  (Our prelude and trailer are
			// less than 400 bytes.)
			snprintf(content + strlen(content), avail,
			    "You should be automatically redirected.");
			avail = sizeof(content) - strlen(content);
		} else if (redirect != NULL) {
			// TODO: redirect should be URL encoded.
			snprintf(content + strlen(content), avail,
			    "You should be automatically redirected to <a "
			    "href=\"%s\">%s</a>.",
			    redirect, redirect);
			avail = sizeof(content) - strlen(content);
		}
		snprintf(content + strlen(content), avail, "%s", suffix);
		body = content;
	}
	if (strlen(body) > 0) {
		nni_http_set_content_type(conn, "text/html; charset=UTF-8");
		// if the follow fails, live with it (ENOMEM, so no body).
		(void) nni_http_copy_body(conn, body, strlen(body));
	}
	return (0);
}